

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O2

int vardata_validate(vardata *data)

{
  vardata_feature *pvVar1;
  vardata_variant *pvVar2;
  vardata_mode *pvVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  
  if (data->validated == 0) {
    data->validated = 1;
    uVar4 = data->featuresnum;
    uVar8 = 0;
    uVar12 = 0;
    if (0 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    lVar9 = 0x18;
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      puVar5 = mask_new(uVar4);
      pvVar1 = data->features;
      *(uint32_t **)((long)pvVar1 + lVar9 + -8) = puVar5;
      puVar6 = mask_new(uVar4);
      *(uint32_t **)((long)&pvVar1->name + lVar9) = puVar6;
      puVar5[uVar8 >> 5 & 0x7ffffff] = puVar5[uVar8 >> 5 & 0x7ffffff] | 1 << ((byte)uVar8 & 0x1f);
      lVar9 = lVar9 + 0x40;
    }
    uVar12 = 0;
    uVar8 = (ulong)(uint)data->variantsnum;
    if (data->variantsnum < 1) {
      uVar8 = uVar12;
    }
    for (; uVar8 * 0x30 - uVar12 != 0; uVar12 = uVar12 + 0x30) {
      puVar5 = mask_new(uVar4);
      *(uint32_t **)((long)&data->variants->fmask + uVar12) = puVar5;
    }
    uVar12 = 0;
    uVar8 = (ulong)(uint)data->modesnum;
    if (data->modesnum < 1) {
      uVar8 = uVar12;
    }
    for (; uVar8 * 0x30 - uVar12 != 0; uVar12 = uVar12 + 0x30) {
      puVar5 = mask_new(uVar4);
      *(uint32_t **)((long)&data->modes->rfmask + uVar12) = puVar5;
    }
    for (uVar8 = 0; uVar10 = 1, (long)uVar8 < (long)(int)uVar4; uVar8 = uVar8 + 1) {
      for (lVar9 = 0; lVar9 < data->features[uVar8].impliesnum; lVar9 = lVar9 + 1) {
        iVar11 = data->features[uVar8].implies[lVar9];
        lVar13 = 0x10;
        for (lVar7 = 0; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
          puVar5 = *(uint32_t **)((long)&data->features->name + lVar13);
          if ((puVar5[uVar8 >> 5 & 0x7ffffff] & 1 << ((byte)uVar8 & 0x1f)) != 0) {
            mask_or(puVar5,data->features[iVar11].ifmask,uVar4);
            uVar4 = data->featuresnum;
          }
          lVar13 = lVar13 + 0x40;
        }
      }
    }
    for (uVar8 = 0; (long)uVar8 < (long)(int)uVar4; uVar8 = uVar8 + 1) {
      pvVar1 = data->features;
      for (lVar9 = 0; lVar9 < pvVar1[uVar8].conflictsnum; lVar9 = lVar9 + 1) {
        iVar11 = pvVar1[uVar8].conflicts[lVar9];
        pvVar1[uVar8].cfmask[iVar11 / 0x20] =
             pvVar1[uVar8].cfmask[iVar11 / 0x20] | 1 << ((byte)iVar11 & 0x1f);
        pvVar1[iVar11].cfmask[uVar8 >> 5 & 0x7ffffff] =
             pvVar1[iVar11].cfmask[uVar8 >> 5 & 0x7ffffff] | 1 << ((byte)uVar8 & 0x1f);
      }
      uVar4 = data->featuresnum;
    }
    while (uVar10 != 0) {
      uVar10 = 0;
      for (lVar9 = 0; lVar9 < (int)uVar4; lVar9 = lVar9 + 1) {
        lVar13 = 0x18;
        for (uVar8 = 0; (long)uVar8 < (long)(int)uVar4; uVar8 = uVar8 + 1) {
          pvVar1 = data->features;
          if ((pvVar1[lVar9].ifmask[uVar8 >> 5 & 0x7ffffff] >> ((uint)uVar8 & 0x1f) & 1) != 0) {
            uVar4 = mask_or_r(pvVar1[lVar9].cfmask,*(uint32_t **)((long)&pvVar1->name + lVar13),
                              uVar4);
            uVar10 = uVar10 | uVar4;
            uVar4 = data->featuresnum;
          }
          lVar13 = lVar13 + 0x40;
        }
      }
    }
    lVar9 = 0;
    iVar11 = 0;
    for (uVar8 = 0; (long)uVar8 < (long)(int)uVar4; uVar8 = uVar8 + 1) {
      if ((*(uint *)(*(long *)((long)&data->features->cfmask + lVar9) + (uVar8 >> 5 & 0x7ffffff) * 4
                    ) >> ((uint)uVar8 & 0x1f) & 1) != 0) {
        fprintf(_stderr,"vardata %s: feature %s conflicts with itself!\n",data->name,
                *(undefined8 *)((long)&data->features->name + lVar9));
        uVar4 = data->featuresnum;
        iVar11 = 1;
      }
      lVar9 = lVar9 + 0x40;
    }
    for (lVar9 = 0; lVar9 < data->variantsnum; lVar9 = lVar9 + 1) {
      for (lVar13 = 0; pvVar2 = data->variants, lVar13 < pvVar2[lVar9].featuresnum;
          lVar13 = lVar13 + 1) {
        mask_or(pvVar2[lVar9].fmask,data->features[pvVar2[lVar9].features[lVar13]].ifmask,
                data->featuresnum);
      }
    }
    for (lVar9 = 0; lVar9 < data->modesnum; lVar9 = lVar9 + 1) {
      pvVar3 = data->modes;
      for (lVar13 = 0; lVar13 < pvVar3[lVar9].rfeaturesnum; lVar13 = lVar13 + 1) {
        pvVar3[lVar9].rfmask[pvVar3[lVar9].rfeatures[lVar13] / 0x20] =
             pvVar3[lVar9].rfmask[pvVar3[lVar9].rfeatures[lVar13] / 0x20] |
             1 << ((byte)pvVar3[lVar9].rfeatures[lVar13] & 0x1f);
      }
    }
    return iVar11;
  }
  abort();
}

Assistant:

int vardata_validate(struct vardata *data) {
	int res = 0;
	if (data->validated)
		abort();
	data->validated = 1;
	int i, j;
	for (i = 0; i < data->featuresnum; i++) {
		data->features[i].ifmask = mask_new(data->featuresnum);
		data->features[i].cfmask = mask_new(data->featuresnum);
		mask_set(data->features[i].ifmask, i);
	}
	for (i = 0; i < data->variantsnum; i++) {
		data->variants[i].fmask = mask_new(data->featuresnum);
	}
	for (i = 0; i < data->modesnum; i++) {
		data->modes[i].rfmask = mask_new(data->featuresnum);
	}
	/* implies */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].impliesnum; j++) {
			int k = data->features[i].implies[j];
			int l;
			for (l = 0; l < data->featuresnum; l++) {
				if (mask_get(data->features[l].ifmask, i)) {
					mask_or(data->features[l].ifmask, data->features[k].ifmask, data->featuresnum);
				}
			}
		}
	}
	/* conflicts */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].conflictsnum; j++) {
			int k = data->features[i].conflicts[j];
			mask_set(data->features[i].cfmask, k);
			mask_set(data->features[k].cfmask, i);
		}
	}
	int p = 1;
	while (p) {
		p = 0;
		for (i = 0; i < data->featuresnum; i++) {
			for (j = 0; j < data->featuresnum; j++) {
				if (mask_get(data->features[i].ifmask, j)) {
					p |= mask_or_r(data->features[i].cfmask, data->features[j].cfmask, data->featuresnum);
				}
			}
		}
	}
	for (i = 0; i < data->featuresnum; i++) {
		if (mask_get(data->features[i].cfmask, i)) {
			fprintf(stderr, "vardata %s: feature %s conflicts with itself!\n", data->name, data->features[i].name);
			res = 1;
		}
	}
	/* variants */
	for (i = 0; i < data->variantsnum; i++) {
		for (j = 0; j < data->variants[i].featuresnum; j++) {
			int k = data->variants[i].features[j];
			mask_or(data->variants[i].fmask, data->features[k].ifmask, data->featuresnum);
		}
	}
	/* variants */
	for (i = 0; i < data->modesnum; i++) {
		for (j = 0; j < data->modes[i].rfeaturesnum; j++) {
			int k = data->modes[i].rfeatures[j];
			mask_set(data->modes[i].rfmask, k);
		}
	}
	return res;
}